

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectjson.cpp
# Opt level: O0

int collectJson(QStringList *jsonFiles,QString *outputFile,bool skipStdIn)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  QString *s;
  byte in_DL;
  QString *in_RSI;
  long in_FS_OFFSET;
  QString *jsonFile;
  add_const_t<QList<QString>_> *__range1;
  QJsonDocument doc;
  QFile f_1;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList jsonFilesSorted;
  QFile f;
  QJsonArray allMetaObjects;
  QFile output;
  undefined4 in_stack_fffffffffffffde8;
  CaseSensitivity in_stack_fffffffffffffdec;
  FILE *in_stack_fffffffffffffdf0;
  QString *in_stack_fffffffffffffe08;
  QJsonArray *in_stack_fffffffffffffe20;
  FILE *pFVar5;
  QFile *in_stack_fffffffffffffe28;
  int local_1a4;
  undefined1 local_1a0 [24];
  undefined1 *local_188;
  QString local_180 [3];
  undefined1 *local_130;
  undefined1 *local_128;
  QString *local_120;
  const_iterator local_118;
  const_iterator local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  QString local_f0 [2];
  uint local_bc;
  undefined1 local_b8 [16];
  char *local_a8;
  QString local_a0 [3];
  QString local_50 [2];
  uint local_1c;
  undefined1 *local_18;
  char *local_10;
  char *local_8;
  
  local_8 = *(char **)(in_FS_OFFSET + 0x28);
  QHashSeed::setDeterministicGlobalSeed();
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&stack0xffffffffffffffe8);
  bVar1 = QString::isEmpty((QString *)0x1068a8);
  if (bVar1) {
    in_stack_fffffffffffffe28 = _stdout;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffdec);
    QFlags<QFileDevice::FileHandleFlag>::QFlags
              ((QFlags<QFileDevice::FileHandleFlag> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffdec);
    uVar2 = QFile::open((_IO_FILE *)&stack0xffffffffffffffe8,
                        (QFlags_conflict *)in_stack_fffffffffffffe28,
                        (QFlags_conflict *)(ulong)local_1c);
    if ((uVar2 & 1) == 0) {
      pFVar5 = _stderr;
      QIODevice::errorString();
      QtPrivate::asString(local_50);
      QString::toLocal8Bit(in_stack_fffffffffffffe08);
      pcVar3 = QByteArray::constData((QByteArray *)0x106957);
      fprintf(pFVar5,"Error opening stdout for writing: %s\n",pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x10697a);
      QString::~QString((QString *)0x106987);
      local_1a4 = 1;
      goto LAB_00106f68;
    }
  }
  else {
    QFile::setFileName((QString *)&stack0xffffffffffffffe8);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffdec);
    uVar2 = QFile::open((QFlags_conflict *)&stack0xffffffffffffffe8);
    pFVar5 = _stderr;
    if ((uVar2 & 1) == 0) {
      QtPrivate::asString(in_RSI);
      QString::toLocal8Bit(in_stack_fffffffffffffe08);
      pcVar3 = QByteArray::constData((QByteArray *)0x106a17);
      QIODevice::errorString();
      QtPrivate::asString(local_a0);
      QString::toLocal8Bit(in_stack_fffffffffffffe08);
      pcVar4 = QByteArray::constData((QByteArray *)0x106a5b);
      fprintf(pFVar5,"%s: Cannot open file for writing: %s\n",pcVar3,pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x106a83);
      QString::~QString((QString *)0x106a90);
      QByteArray::~QByteArray((QByteArray *)0x106a9d);
      local_1a4 = 1;
      goto LAB_00106f68;
    }
  }
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)&local_a8);
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x106ada);
  if ((bVar1) && ((in_DL & 1) == 0)) {
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)local_b8);
    in_stack_fffffffffffffe08 = _stdin;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffdec);
    QFlags<QFileDevice::FileHandleFlag>::QFlags
              ((QFlags<QFileDevice::FileHandleFlag> *)in_stack_fffffffffffffdf0,
               in_stack_fffffffffffffdec);
    uVar2 = QFile::open((_IO_FILE *)local_b8,(QFlags_conflict *)in_stack_fffffffffffffe08,
                        (QFlags_conflict *)(ulong)local_bc);
    pFVar5 = _stderr;
    if ((uVar2 & 1) == 0) {
      QIODevice::errorString();
      QtPrivate::asString(local_f0);
      QString::toLocal8Bit(in_stack_fffffffffffffe08);
      pcVar3 = QByteArray::constData((QByteArray *)0x106bbf);
      fprintf(pFVar5,"Error opening stdin for reading: %s\n",pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x106be2);
      QString::~QString((QString *)0x106bef);
      local_1a4 = 1;
      bVar1 = true;
    }
    else {
      bVar1 = readFromFile(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        local_1a4 = 1;
        bVar1 = true;
      }
    }
    QFile::~QFile((QFile *)local_b8);
    if (!bVar1) goto LAB_00106c51;
  }
  else {
LAB_00106c51:
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList
              ((QList<QString> *)in_stack_fffffffffffffdf0,
               (QList<QString> *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    QListSpecialMethods<QString>::sort
              ((QListSpecialMethods<QString> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    local_110.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_110 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffdf0);
    local_118.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_118 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffdf0);
    while( true ) {
      local_120 = local_118.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_110,local_118);
      if (!bVar1) break;
      s = QList<QString>::const_iterator::operator*(&local_110);
      local_130 = &DAT_aaaaaaaaaaaaaaaa;
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      QFile::QFile((QFile *)&local_130,(QString *)s);
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffdf0,
                 in_stack_fffffffffffffdec);
      uVar2 = QFile::open((QFlags_conflict *)&local_130);
      if ((uVar2 & 1) == 0) {
        in_stack_fffffffffffffdf0 = _stderr;
        QtPrivate::asString(s);
        QString::toLocal8Bit(in_stack_fffffffffffffe08);
        pcVar3 = QByteArray::constData((QByteArray *)0x106de3);
        QIODevice::errorString();
        QtPrivate::asString(local_180);
        QString::toLocal8Bit(in_stack_fffffffffffffe08);
        pcVar4 = QByteArray::constData((QByteArray *)0x106e27);
        fprintf(in_stack_fffffffffffffdf0,"%s: Cannot open file for reading: %s\n",pcVar3,pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x106e4f);
        QString::~QString((QString *)0x106e5c);
        QByteArray::~QByteArray((QByteArray *)0x106e69);
        local_1a4 = 1;
        bVar1 = true;
      }
      else {
        bVar1 = readFromFile(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        if (bVar1) {
          bVar1 = false;
        }
        else {
          local_1a4 = 1;
          bVar1 = true;
        }
      }
      QFile::~QFile((QFile *)&local_130);
      if (bVar1) goto LAB_00106f4e;
      QList<QString>::const_iterator::operator++(&local_110);
    }
    local_188 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::QJsonDocument((QJsonDocument *)&local_188,(QJsonArray *)&local_a8);
    QJsonDocument::toJson(local_1a0,&local_188,0);
    QIODevice::write((QByteArray *)&stack0xffffffffffffffe8);
    QByteArray::~QByteArray((QByteArray *)0x106f31);
    local_1a4 = 0;
    QJsonDocument::~QJsonDocument((QJsonDocument *)&local_188);
LAB_00106f4e:
    QList<QString>::~QList((QList<QString> *)0x106f5b);
  }
  QJsonArray::~QJsonArray((QJsonArray *)&local_a8);
LAB_00106f68:
  QFile::~QFile((QFile *)&stack0xffffffffffffffe8);
  if (*(char **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1a4;
}

Assistant:

int collectJson(const QStringList &jsonFiles, const QString &outputFile, bool skipStdIn)
{
    QHashSeed::setDeterministicGlobalSeed();

    QFile output;
    if (outputFile.isEmpty()) {
        if (!output.open(stdout, QIODevice::WriteOnly)) {
            fprintf(stderr, "Error opening stdout for writing: %s\n",
                    qPrintable(output.errorString()));
            return EXIT_FAILURE;
        }
    } else {
        output.setFileName(outputFile);
        if (!output.open(QIODevice::WriteOnly)) {
            fprintf(stderr, "%s: Cannot open file for writing: %s\n", qPrintable(outputFile),
                    qPrintable(output.errorString()));
            return EXIT_FAILURE;
        }
    }

    QJsonArray allMetaObjects;
    if (jsonFiles.isEmpty() && !skipStdIn) {
        QFile f;
        if (!f.open(stdin, QIODevice::ReadOnly)) {
            fprintf(stderr, "Error opening stdin for reading: %s\n", qPrintable(f.errorString()));
            return EXIT_FAILURE;
        }

        if (!readFromFile(&f, &allMetaObjects))
            return EXIT_FAILURE;
    }

    QStringList jsonFilesSorted = jsonFiles;
    jsonFilesSorted.sort();
    for (const QString &jsonFile : std::as_const(jsonFilesSorted)) {
        QFile f(jsonFile);
        if (!f.open(QIODevice::ReadOnly)) {
            fprintf(stderr, "%s: Cannot open file for reading: %s\n", qPrintable(jsonFile),
                    qPrintable(f.errorString()));
            return EXIT_FAILURE;
        }

        if (!readFromFile(&f, &allMetaObjects))
            return EXIT_FAILURE;
    }

    QJsonDocument doc(allMetaObjects);
    output.write(doc.toJson());

    return EXIT_SUCCESS;
}